

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# comm.hpp
# Opt level: O0

void __thiscall BCL::read<char>(BCL *this,GlobalPtr<const_char> src,char *dst,size_t size)

{
  BCL *pBVar1;
  debug_error *pdVar2;
  string local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  undefined1 local_e9;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  int local_a4;
  undefined1 local_a0 [4];
  int error_code;
  MPI_Request request;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  char *local_28;
  size_t size_local;
  char *dst_local;
  GlobalPtr<const_char> src_local;
  
  size_local = src.ptr;
  src_local.rank = src.rank;
  local_28 = dst;
  dst_local = (char *)this;
  pBVar1 = (BCL *)backend::nprocs();
  if (pBVar1 < this) {
    request._3_1_ = 1;
    pdVar2 = (debug_error *)__cxa_allocate_exception(0x40);
    std::__cxx11::to_string(&local_88,(unsigned_long)dst_local);
    std::operator+(&local_68,"BCL read(): request to read from rank ",&local_88);
    std::operator+(&local_48,&local_68,", which does not exist");
    debug_error::debug_error(pdVar2,&local_48);
    request._3_1_ = 0;
    __cxa_throw(pdVar2,&debug_error::typeinfo,debug_error::~debug_error);
  }
  local_a4 = MPI_Rget(size_local,(ulong)local_28 & 0xffffffff,&ompi_mpi_char,
                      (ulong)dst_local & 0xffffffff,src_local.rank,(ulong)local_28 & 0xffffffff,
                      &ompi_mpi_char,win,local_a0);
  if (local_a4 != 0) {
    local_e9 = 1;
    pdVar2 = (debug_error *)__cxa_allocate_exception(0x40);
    std::__cxx11::to_string(&local_e8,local_a4);
    std::operator+(&local_c8,"BCL read(): MPI_Rget returned error code ",&local_e8);
    debug_error::debug_error(pdVar2,&local_c8);
    local_e9 = 0;
    __cxa_throw(pdVar2,&debug_error::typeinfo,debug_error::~debug_error);
  }
  local_a4 = MPI_Wait(local_a0,0);
  if (local_a4 != 0) {
    pdVar2 = (debug_error *)__cxa_allocate_exception(0x40);
    std::__cxx11::to_string(&local_130,local_a4);
    std::operator+(&local_110,"BCL read(): MPI_Wait returned error code ",&local_130);
    debug_error::debug_error(pdVar2,&local_110);
    __cxa_throw(pdVar2,&debug_error::typeinfo,debug_error::~debug_error);
  }
  return;
}

Assistant:

inline void read(GlobalPtr<std::add_const_t<T>> src, T *dst, std::size_t size) {
  BCL_DEBUG(
    if (src.rank > BCL::backend::nprocs()) {
      throw debug_error("BCL read(): request to read from rank " +
                        std::to_string(src.rank) + ", which does not exist");
    }
  )
  /*
  if (src.rank == BCL::rank()) {
    std::memcpy(dst, src.local(), size*sizeof(T));
  } else {
    MPI_Request request;
    MPI_Rget(dst, size*sizeof(T), MPI_CHAR, src.rank, src.ptr, size*sizeof(T),
      MPI_CHAR, BCL::win, &request);
    MPI_Wait(&request, MPI_STATUS_IGNORE);
  }
  */
  MPI_Request request;

  int error_code = MPI_Rget(dst, size*sizeof(T), MPI_CHAR,
                            src.rank, src.ptr, size*sizeof(T), MPI_CHAR,
                            BCL::win, &request);
  BCL_DEBUG(
    if (error_code != MPI_SUCCESS) {
      throw debug_error("BCL read(): MPI_Rget returned error code " + std::to_string(error_code));
    }
  )

  error_code = MPI_Wait(&request, MPI_STATUS_IGNORE);
  BCL_DEBUG(
    if (error_code != MPI_SUCCESS) {
      throw debug_error("BCL read(): MPI_Wait returned error code " + std::to_string(error_code));
    }
  )
}